

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteDbRelease(unqlite *pDb)

{
  unqlite_vm *puVar1;
  unqlite_db *puVar2;
  int local_2c;
  int rc;
  unqlite_vm *pNext;
  unqlite_vm *pVm;
  unqlite_db *pStore;
  unqlite *pDb_local;
  
  puVar2 = &pDb->sDB;
  if ((pDb->iFlags & 1U) == 0) {
    local_2c = unqlitePagerCommit(puVar2->pPager);
    if (local_2c != 0) {
      local_2c = unqlitePagerRollback(puVar2->pPager,0);
    }
  }
  else {
    local_2c = unqlitePagerRollback(puVar2->pPager,0);
  }
  unqlitePagerClose(puVar2->pPager);
  pNext = pDb->pVms;
  while (0 < pDb->iVm) {
    puVar1 = pNext->pNext;
    unqliteVmRelease(pNext);
    pDb->iVm = pDb->iVm + -1;
    pNext = puVar1;
  }
  jx9_release((pDb->sDB).pJx9);
  pDb->nMagic = 0x7250;
  SyMemBackendRelease(&pDb->sMem);
  return local_2c;
}

Assistant:

static int unqliteDbRelease(unqlite *pDb)
{
	unqlite_db *pStore = &pDb->sDB;
	unqlite_vm *pVm,*pNext;
	int rc = UNQLITE_OK;
	if( (pDb->iFlags & UNQLITE_FL_DISABLE_AUTO_COMMIT) == 0 ){
		/* Commit any outstanding transaction */
		rc = unqlitePagerCommit(pStore->pPager);
		if( rc != UNQLITE_OK ){
			/* Rollback the transaction */
			rc = unqlitePagerRollback(pStore->pPager,FALSE);
		}
	}else{
		/* Rollback any outstanding transaction */
		rc = unqlitePagerRollback(pStore->pPager,FALSE);
	}
	/* Close the pager */
	unqlitePagerClose(pStore->pPager);
	/* Release any active VM's */
	pVm = pDb->pVms;
	for(;;){
		if( pDb->iVm < 1 ){
			break;
		}
		/* Point to the next entry */
		pNext = pVm->pNext;
		unqliteVmRelease(pVm);
		pVm = pNext;
		pDb->iVm--;
	}
	/* Release the Jx9 handle */
	jx9_release(pStore->pJx9);
	/* Set a dummy magic number */
	pDb->nMagic = 0x7250;
	/* Release the whole memory subsystem */
	SyMemBackendRelease(&pDb->sMem);
	/* Commit or rollback result */
	return rc;
}